

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

Blob<224> * bitreverse<Blob<224>>(Blob<224> *__return_storage_ptr__,Blob<224> *n,size_t b)

{
  size_t i;
  ulong uVar1;
  
  Blob<224>::Blob(__return_storage_ptr__,0);
  for (uVar1 = 0; uVar1 < b; uVar1 = uVar1 + 8) {
    Blob<224>::operator<<=(__return_storage_ptr__,8);
    __return_storage_ptr__->bytes[0] =
         __return_storage_ptr__->bytes[0] |
         bitrev(unsigned_char)::revbits[*(uint *)n->bytes & 0xf] << 4 |
         bitrev(unsigned_char)::revbits[*(uint *)n->bytes >> 4 & 0xf];
    Blob<224>::operator>>=(n,8);
  }
  return __return_storage_ptr__;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; i += 8) {
        rv <<= 8;
        rv |= bitrev(n & 0xff); // ensure overloaded |= op for Blob not underflowing
        n >>= 8;
    }
    return rv;
}